

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

store * store_home(player *p)

{
  town_conflict *local_30;
  town *hometown;
  player *ppStack_20;
  wchar_t i;
  store *store;
  player *p_local;
  
  local_30 = (town_conflict *)0x0;
  if ((((player->opts).opt[0x2b] & 1U) == 0) || (p->home != 0)) {
    for (hometown._4_4_ = 0; hometown._4_4_ < world->num_towns; hometown._4_4_ = hometown._4_4_ + 1)
    {
      if (world->towns[hometown._4_4_].index == (int)p->home) {
        local_30 = world->towns + hometown._4_4_;
      }
    }
    if (local_30 == (town_conflict *)0x0) {
      __assert_fail("hometown",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x266,"struct store *store_home(struct player *)");
    }
    for (ppStack_20 = (player *)local_30->stores;
        (ppStack_20 != (player *)0x0 && ((ppStack_20->old_grid).x != store_home_idx));
        ppStack_20 = (player *)ppStack_20->race) {
    }
    p_local = ppStack_20;
  }
  else {
    p_local = (player *)0x0;
  }
  return (store *)p_local;
}

Assistant:

struct store *store_home(struct player *p)
{
	struct store *store;
	int i;
	struct town *hometown = NULL;

	if (OPT(player, birth_thrall) && !p->home) return NULL; 

	for (i = 0; i < world->num_towns; i++) {
		if (world->towns[i].index == p->home) {
			hometown = &world->towns[i];
		}
	}
	assert(hometown);

	store = hometown->stores;
	while (store) {
		if (store->sidx == store_home_idx) break;
		store = store->next;
	}
	return store;
}